

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip.cpp
# Opt level: O1

void zmq::assert_success_or_recoverable(fd_t s_,int rc_)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  int err;
  socklen_t len;
  uint local_10;
  socklen_t local_c;
  
  if (rc_ != -1) {
    return;
  }
  local_10 = 0;
  local_c = 4;
  iVar2 = getsockopt(s_,1,4,&local_10,&local_c);
  if (iVar2 == -1) {
    puVar3 = (uint *)__errno_location();
    local_10 = *puVar3;
  }
  uVar1 = local_10;
  if (local_10 != 0) {
    puVar3 = (uint *)__errno_location();
    *puVar3 = uVar1;
    if ((((0xd < uVar1 - 100) || ((0x2c1fU >> (uVar1 - 100 & 0x1f) & 1) == 0)) && (uVar1 != 4)) &&
       (uVar1 != 0x16)) {
      assert_success_or_recoverable((zmq *)(ulong)uVar1);
    }
  }
  return;
}

Assistant:

void zmq::assert_success_or_recoverable (zmq::fd_t s_, int rc_)
{
#ifdef ZMQ_HAVE_WINDOWS
    if (rc_ != SOCKET_ERROR) {
        return;
    }
#else
    if (rc_ != -1) {
        return;
    }
#endif

    //  Check whether an error occurred
    int err = 0;
#if defined ZMQ_HAVE_HPUX || defined ZMQ_HAVE_VXWORKS
    int len = sizeof err;
#else
    socklen_t len = sizeof err;
#endif

    const int rc = getsockopt (s_, SOL_SOCKET, SO_ERROR,
                               reinterpret_cast<char *> (&err), &len);

    //  Assert if the error was caused by 0MQ bug.
    //  Networking problems are OK. No need to assert.
#ifdef ZMQ_HAVE_WINDOWS
    zmq_assert (rc == 0);
    if (err != 0) {
        wsa_assert (err == WSAECONNREFUSED || err == WSAECONNRESET
                    || err == WSAECONNABORTED || err == WSAEINTR
                    || err == WSAETIMEDOUT || err == WSAEHOSTUNREACH
                    || err == WSAENETUNREACH || err == WSAENETDOWN
                    || err == WSAENETRESET || err == WSAEACCES
                    || err == WSAEINVAL || err == WSAEADDRINUSE);
    }
#else
    //  Following code should handle both Berkeley-derived socket
    //  implementations and Solaris.
    if (rc == -1)
        err = errno;
    if (err != 0) {
        errno = err;
        errno_assert (errno == ECONNREFUSED || errno == ECONNRESET
                      || errno == ECONNABORTED || errno == EINTR
                      || errno == ETIMEDOUT || errno == EHOSTUNREACH
                      || errno == ENETUNREACH || errno == ENETDOWN
                      || errno == ENETRESET || errno == EINVAL);
    }
#endif
}